

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.c
# Opt level: O2

size_t wal_estimate_size(image_data im,int wal_type)

{
  size_t sVar1;
  long lVar2;
  bool bVar3;
  
  if (wal_type == 1) {
    sVar1 = 100;
    lVar2 = 4;
    while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
      sVar1 = sVar1 + (im.height * im.width + (uint)(im.height * im.width == 0));
      im.width = im.width >> 1;
      im.height = im.height >> 1;
    }
  }
  else if (wal_type == 2) {
    sVar1 = 0x37c;
    lVar2 = 9;
    while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
      sVar1 = sVar1 + (im.height * im.width + (uint)(im.height * im.width == 0));
      im.width = im.width >> 1;
      im.height = im.height >> 1;
    }
  }
  else {
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

size_t wal_estimate_size(struct image_data im, int wal_type)
{
	size_t result = 0, mip = 0;
	uint32_t width = im.width, height = im.height, size = 0;
	switch (wal_type) {
		case WAL_TYPE_QUAKE2:
			result += WAL_Q2_HEADER_SIZE;
			for (mip = 0; mip < MIP_LEVELS_Q2; mip++) {
				size = width * height;
				result += size > 0 ? size : 1;
				width /= 2;
				height /= 2;
			}
			break;
		case WAL_TYPE_DAIKATANA:
			result += WAL_DK_HEADER_SIZE;
			for (mip = 0; mip < MIP_LEVELS_DK; mip++) {
				size = width * height;
				result += size > 0 ? size : 1;
				width /= 2;
				height /= 2;
			}
			break;
	}
	return result;
}